

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O1

void __thiscall SatPos::CalculateEk(SatPos *this,double Mk,double ecc,double *Ek)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double __x;
  
  __x = 1.0;
  uVar1 = 0xffffffff;
  do {
    uVar1 = uVar1 + 1;
    if (10 < uVar1) {
      return;
    }
    dVar3 = sin(__x);
    dVar3 = dVar3 * ecc + Mk;
    *Ek = dVar3;
    dVar4 = dVar3 - __x;
    uVar2 = -(ulong)(1e-07 <= ABS(dVar4));
    __x = (double)(~uVar2 & (ulong)__x | (ulong)dVar3 & uVar2);
  } while (1e-07 <= ABS(dVar4));
  return;
}

Assistant:

void SatPos::CalculateEk(const double Mk, const double ecc, double &Ek)
{
    double Ek0 = 1;
    int count = 0;
    while (count <= 10)
    {
        Ek = Mk + ecc * sin(Ek0);
        double error = abs(Ek - Ek0);
        if(error < 1e-7)
            break;
        Ek0 = Ek;
        count ++;
    }
}